

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::XMLReader::skipIfQuote(XMLReader *this,XMLCh *chGotten)

{
  XMLCh XVar1;
  bool bVar2;
  XMLSize_t XVar3;
  
  XVar3 = this->fCharIndex;
  if (XVar3 == this->fCharsAvail) {
    bVar2 = refreshCharBuffer(this);
    if (!bVar2) {
      return false;
    }
    XVar3 = this->fCharIndex;
  }
  XVar1 = this->fCharBuf[XVar3];
  *chGotten = XVar1;
  if ((XVar1 != L'\'') && (XVar1 != L'\"')) {
    return false;
  }
  this->fCharIndex = XVar3 + 1;
  this->fCurCol = this->fCurCol + 1;
  return true;
}

Assistant:

bool XMLReader::skipIfQuote(XMLCh& chGotten)
{
    if (fCharIndex == fCharsAvail && !refreshCharBuffer())
        return false;

    chGotten = fCharBuf[fCharIndex];
    if ((chGotten == chDoubleQuote) || (chGotten == chSingleQuote))
    {
        fCharIndex++;
        fCurCol++;
        return true;
    }
    return false;
}